

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

void __thiscall Camera::updateCameraVectors(Camera *this)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  dVar3 = cos((double)(this->Yaw * 0.017453292));
  dVar4 = cos((double)(this->Pitch * 0.017453292));
  fVar5 = (float)(dVar4 * dVar3);
  dVar3 = sin((double)(this->Pitch * 0.017453292));
  fVar6 = (float)dVar3;
  dVar3 = sin((double)(this->Yaw * 0.017453292));
  dVar4 = cos((double)(this->Pitch * 0.017453292));
  fVar8 = (float)(dVar4 * dVar3);
  fVar7 = fVar8 * fVar8 + fVar6 * fVar6 + fVar5 * fVar5;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = 1.0 / fVar7;
  fVar8 = fVar7 * fVar8;
  (this->Front).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar5 * fVar7);
  (this->Front).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar6 * fVar7);
  (this->Front).field_2.z = fVar8;
  fVar5 = (this->Front).field_0.x;
  fVar6 = (this->Front).field_1.y;
  fVar7 = (this->WorldUp).field_2.z;
  fVar1 = (this->WorldUp).field_0.x;
  fVar2 = (this->WorldUp).field_1.y;
  fVar9 = fVar6 * fVar7 - fVar8 * fVar2;
  fVar7 = fVar8 * fVar1 - fVar7 * fVar5;
  fVar6 = fVar5 * fVar2 - fVar6 * fVar1;
  fVar5 = fVar6 * fVar6 + fVar7 * fVar7 + fVar9 * fVar9;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  fVar6 = fVar6 * fVar5;
  (this->Right).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar9 * fVar5);
  (this->Right).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar7 * fVar5);
  (this->Right).field_2.z = fVar6;
  fVar5 = (this->Right).field_0.x;
  fVar7 = (this->Right).field_1.y;
  fVar8 = (this->Front).field_2.z;
  fVar1 = (this->Front).field_0.x;
  fVar2 = (this->Front).field_1.y;
  fVar9 = fVar7 * fVar8 - fVar6 * fVar2;
  fVar6 = fVar6 * fVar1 - fVar8 * fVar5;
  fVar7 = fVar5 * fVar2 - fVar7 * fVar1;
  fVar5 = fVar7 * fVar7 + fVar6 * fVar6 + fVar9 * fVar9;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  (this->Up).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar9 * fVar5);
  (this->Up).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar6 * fVar5);
  (this->Up).field_2.z = fVar7 * fVar5;
  return;
}

Assistant:

void updateCameraVectors() {
        // Calculate the new Front vector
        glm::vec3 front;
        front.x = cos(glm::radians(this->Yaw)) * cos(glm::radians(this->Pitch));
        front.y = sin(glm::radians(this->Pitch));
        front.z = sin(glm::radians(this->Yaw)) * cos(glm::radians(this->Pitch));
        // Normalize the vectors, because their length gets closer to 0 the more you look up or down
        // which results in slower movement.
        this->Front = glm::normalize(front);
        // Also re-calculate the Right and Up vector
        this->Right = glm::normalize(glm::cross(this->Front, this->WorldUp));
        this->Up = glm::normalize(glm::cross(this->Right, this->Front));
    }